

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::CubicSpline::sort_permutation
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CubicSpline *this,
          vector<double,_std::allocator<double>_> *v)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar1;
  int iVar2;
  ulong uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  allocator_type local_29;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_29);
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  iVar2 = 0;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var4._M_current = __first._M_current; _Var4._M_current != __last._M_current;
      _Var4._M_current = _Var4._M_current + 1) {
    *_Var4._M_current = iVar2;
    iVar2 = iVar2 + 1;
  }
  if (__first._M_current != __last._M_current) {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                )v);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                  )v);
    }
    else {
      _Var4._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
                (__first,_Var4,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                  )v);
      for (; _Var4._M_current != __last._M_current; _Var4._M_current = _Var4._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>>
                  (_Var4,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_OpenMD[P]OpenMD_src_math_CubicSpline_cpp:331:35)>
                          )v);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CubicSpline::sort_permutation(
      const std::vector<double>& v) const {
    std::vector<int> p(v.size());

    std::iota(p.begin(), p.end(), 0);
    std::sort(p.begin(), p.end(), [&v](int a, int b) { return (v[a] < v[b]); });

    return p;
  }